

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O3

assetsys_error_t assetsys_dismount(assetsys_t *sys,char *path,char *mounted_as)

{
  strpool_t *pool;
  assetsys_internal_mount_t *paVar1;
  mz_bool mVar2;
  assetsys_error_t aVar3;
  int iVar4;
  size_t sVar5;
  unsigned_long_long handle;
  unsigned_long_long handle_00;
  int iVar6;
  unsigned_long_long handle_01;
  long lVar7;
  long lVar8;
  long lVar9;
  void *__dest;
  
  if (path == (char *)0x0) {
    return ASSETSYS_ERROR_INVALID_PARAMETER;
  }
  if (mounted_as != (char *)0x0) {
    pool = &sys->strpool;
    sVar5 = strlen(path);
    handle = strpool_inject(pool,path,(int)sVar5);
    sVar5 = strlen(mounted_as);
    handle_00 = strpool_inject(pool,mounted_as,(int)sVar5);
    if (0 < (long)sys->mounts_count) {
      paVar1 = sys->mounts;
      lVar9 = 0;
      iVar6 = 0;
      do {
        if ((*(unsigned_long_long *)((long)&paVar1->mounted_as + lVar9) == handle_00) &&
           (*(unsigned_long_long *)((long)&paVar1->path + lVar9) == handle)) {
          aVar3 = ASSETSYS_SUCCESS;
          handle_01 = handle_00;
          if (*(int *)((long)&paVar1->type + lVar9) == 1) {
            mVar2 = mz_zip_reader_end((mz_zip_archive *)
                                      ((long)&(paVar1->zip).m_archive_size + lVar9));
            aVar3 = (uint)(mVar2 != 0) * 4 + ASSETSYS_ERROR_FAILED_TO_CLOSE_ZIP;
            handle_01 = *(unsigned_long_long *)((long)&paVar1->mounted_as + lVar9);
          }
          strpool_decref(pool,handle_01);
          strpool_decref(pool,*(unsigned_long_long *)((long)&paVar1->path + lVar9));
          strpool_discard(pool,handle_00);
          strpool_discard(pool,handle);
          if (0 < *(int *)((long)&paVar1->dirs_count + lVar9)) {
            lVar7 = 0;
            do {
              assetsys_internal_remove_collated
                        (sys,*(int *)(*(long *)((long)&paVar1->dirs + lVar9) + lVar7 * 4));
              lVar7 = lVar7 + 1;
            } while (lVar7 < *(int *)((long)&paVar1->dirs_count + lVar9));
          }
          if (0 < *(int *)((long)&paVar1->files_count + lVar9)) {
            lVar8 = 8;
            lVar7 = 0;
            do {
              assetsys_internal_remove_collated
                        (sys,*(int *)(*(long *)((long)&paVar1->files + lVar9) + lVar8));
              lVar7 = lVar7 + 1;
              lVar8 = lVar8 + 0xc;
            } while (lVar7 < *(int *)((long)&paVar1->files_count + lVar9));
          }
          free(*(void **)((long)&paVar1->dirs + lVar9));
          free(*(void **)((long)&paVar1->files + lVar9));
          iVar4 = sys->mounts_count;
          if (0 < iVar4 - iVar6) {
            __dest = (void *)((long)&sys->mounts->path + lVar9);
            memcpy(__dest,(void *)((long)__dest + 0x98),(ulong)(uint)(iVar4 - iVar6) * 0x98);
            iVar4 = sys->mounts_count;
          }
          sys->mounts_count = iVar4 + -1;
          return aVar3;
        }
        iVar6 = iVar6 + 1;
        lVar9 = lVar9 + 0x98;
      } while ((long)sys->mounts_count * 0x98 - lVar9 != 0);
    }
    strpool_discard(pool,handle_00);
    strpool_discard(pool,handle);
  }
  return ASSETSYS_ERROR_INVALID_MOUNT;
}

Assistant:

assetsys_error_t assetsys_dismount( assetsys_t* sys, char const* path, char const* mounted_as )
    {
    if( !path ) return ASSETSYS_ERROR_INVALID_PARAMETER;
    if( !mounted_as ) return ASSETSYS_ERROR_INVALID_MOUNT;

    ASSETSYS_U64 path_handle = strpool_inject( &sys->strpool, path, (int) strlen( path ) );
    ASSETSYS_U64 mount_handle = strpool_inject( &sys->strpool, mounted_as, (int) strlen( mounted_as ) );

    for( int i = 0; i < sys->mounts_count; ++i )
        {
        struct assetsys_internal_mount_t* mount = &sys->mounts[ i ];
        if( mount->mounted_as == mount_handle && mount->path == path_handle )
            {
            mz_bool result = 1;
            if( mount->type == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP ) result = mz_zip_reader_end( &mount->zip );

            strpool_decref( &sys->strpool, mount->mounted_as );
            strpool_decref( &sys->strpool, mount->path );
            strpool_discard( &sys->strpool, mount_handle );
            strpool_discard( &sys->strpool, path_handle );
            
            for( int j = 0; j < mount->dirs_count; ++j )
                assetsys_internal_remove_collated( sys, mount->dirs[ j ].collated_index );

            for( int j = 0; j < mount->files_count; ++j )
                assetsys_internal_remove_collated( sys, mount->files[ j ].collated_index );

            ASSETSYS_FREE( sys->memctx, mount->dirs );
            ASSETSYS_FREE( sys->memctx, mount->files );

            int count = sys->mounts_count - i;
            if( count > 0 ) memcpy( &sys->mounts[ i ], &sys->mounts[ i + 1 ], sizeof( *sys->mounts ) * count );
            --sys->mounts_count;

            return !result ? ASSETSYS_ERROR_FAILED_TO_CLOSE_ZIP : ASSETSYS_SUCCESS;
            }
        }

    strpool_discard( &sys->strpool, mount_handle );
    strpool_discard( &sys->strpool, path_handle );
    return ASSETSYS_ERROR_INVALID_MOUNT;
    }